

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::ExtractSubrange
          (RepeatedField<long> *this,int start,int num,long *elements)

{
  int index;
  LogMessage *pLVar1;
  long *plVar2;
  int local_f4;
  int local_f0;
  int i_1;
  int i;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  long *local_20;
  long *elements_local;
  int num_local;
  int start_local;
  RepeatedField<long> *this_local;
  
  local_59 = 0;
  local_20 = elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  if (start < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2d9);
    local_59 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(local_6d,pLVar1);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  local_a9 = 0;
  if ((int)elements_local < 0) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2da);
    local_a9 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_aa,pLVar1);
  }
  if ((local_a9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a8);
  }
  i_1._3_1_ = 0;
  if (this->current_size_ < elements_local._4_4_ + (int)elements_local) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&i,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x2db);
    i_1._3_1_ = 1;
    pLVar1 = internal::LogMessage::operator<<
                       ((LogMessage *)&i,"CHECK failed: (start + num) <= (this->current_size_): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&i_1 + 2),pLVar1);
  }
  if ((i_1._3_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)&i);
  }
  if (local_20 != (long *)0x0) {
    for (local_f0 = 0; local_f0 < (int)elements_local; local_f0 = local_f0 + 1) {
      plVar2 = Get(this,local_f0 + elements_local._4_4_);
      local_20[local_f0] = *plVar2;
    }
  }
  if (0 < (int)elements_local) {
    for (local_f4 = elements_local._4_4_ + (int)elements_local; local_f4 < this->current_size_;
        local_f4 = local_f4 + 1) {
      index = local_f4 - (int)elements_local;
      plVar2 = Get(this,local_f4);
      Set(this,index,plVar2);
    }
    Truncate(this,this->current_size_ - (int)elements_local);
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}